

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall
QHttpNetworkReplyPrivate::readBodyFast
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *rb)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (**(code **)(*(long *)socket + 0xa0))(socket);
  lVar3 = this->bodyLength - this->contentRead;
  if (lVar1 < lVar3) {
    lVar3 = lVar1;
  }
  if (((this->readBufferMaxSize == 0) || (lVar3 < this->readBufferMaxSize)) && (lVar3 == 0)) {
    lVar3 = 0;
  }
  else {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_48.size = 0;
    QByteArray::resize((longlong)&local_48);
    pcVar2 = QByteArray::data((QByteArray *)&local_48);
    lVar3 = QIODevice::read((char *)socket,(longlong)pcVar2);
    if (lVar3 == -1) {
      QByteArray::clear();
      lVar3 = 0;
    }
    else {
      QByteArray::resize((longlong)&local_48);
      QByteDataBuffer::append(rb,(QByteArray *)&local_48);
      lVar1 = this->contentRead + lVar3;
      if (lVar1 == this->bodyLength) {
        this->state = AllDoneState;
      }
      this->contentRead = lVar1;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBodyFast(QIODevice *socket, QByteDataBuffer *rb)
{

    qint64 toBeRead = qMin(socket->bytesAvailable(), bodyLength - contentRead);
    if (readBufferMaxSize)
        toBeRead = qMin(toBeRead, readBufferMaxSize);

    if (!toBeRead)
        return 0;

    QByteArray bd;
    bd.resize(toBeRead);
    qint64 haveRead = socket->read(bd.data(), toBeRead);
    if (haveRead == -1) {
        bd.clear();
        return 0; // ### error checking here;
    }
    bd.resize(haveRead);

    rb->append(bd);

    if (contentRead + haveRead == bodyLength) {
        state = AllDoneState;
    }

    contentRead += haveRead;
    return haveRead;
}